

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O0

cgltf_result
cgltf_copy_extras_json(cgltf_data *data,cgltf_extras *extras,char *dest,cgltf_size *dest_size)

{
  ulong __n;
  cgltf_size json_size;
  cgltf_size *dest_size_local;
  char *dest_local;
  cgltf_extras *extras_local;
  cgltf_data *data_local;
  
  __n = extras->end_offset - extras->start_offset;
  if (dest == (char *)0x0) {
    if (dest_size == (cgltf_size *)0x0) {
      data_local._4_4_ = cgltf_result_invalid_options;
    }
    else {
      *dest_size = __n + 1;
      data_local._4_4_ = cgltf_result_success;
    }
  }
  else {
    if (*dest_size + 1 < __n) {
      strncpy(dest,data->json + extras->start_offset,*dest_size - 1);
      dest[*dest_size - 1] = '\0';
    }
    else {
      strncpy(dest,data->json + extras->start_offset,__n);
      dest[__n] = '\0';
    }
    data_local._4_4_ = cgltf_result_success;
  }
  return data_local._4_4_;
}

Assistant:

cgltf_result cgltf_copy_extras_json(const cgltf_data* data, const cgltf_extras* extras, char* dest, cgltf_size* dest_size)
{
	cgltf_size json_size = extras->end_offset - extras->start_offset;

	if (!dest)
	{
		if (dest_size)
		{
			*dest_size = json_size + 1;
			return cgltf_result_success;
		}
		return cgltf_result_invalid_options;
	}

	if (*dest_size + 1 < json_size)
	{
		strncpy(dest, data->json + extras->start_offset, *dest_size - 1);
		dest[*dest_size - 1] = 0;
	}
	else
	{
		strncpy(dest, data->json + extras->start_offset, json_size);
		dest[json_size] = 0;
	}

	return cgltf_result_success;
}